

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_TypeAttributeNotFIXorFIXT::
TestreadFromDocument_TypeAttributeNotFIXorFIXT(TestreadFromDocument_TypeAttributeNotFIXorFIXT *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"readFromDocument_TypeAttributeNotFIXorFIXT","DataDictionaryTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0x4d1);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031c050;
  return;
}

Assistant:

TEST(readFromDocument_TypeAttributeNotFIXorFIXT) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml = "<fix type='WrongType' major='4' minor='2' servicepack='0'></fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}